

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_textedit_init_fixed(nk_text_edit *state,void *memory,nk_size size)

{
  nk_str *__s;
  nk_text_edit *__s_00;
  void *__s_01;
  size_t __n;
  ulong __n_00;
  size_t __n_01;
  
  if (size != 0 && (memory != (void *)0x0 && state != (nk_text_edit *)0x0)) {
    __n = (ulong)state & 3;
    if (__n == 0) {
      __n = 0x1500;
      __s_00 = state;
    }
    else {
      __n_01 = -__n + 4;
      memset(state,0,__n_01);
      memset((void *)((long)state + __n_01),0,0x1504);
      __s_00 = (nk_text_edit *)((long)state + -__n + 0x1508);
    }
    memset(__s_00,0,__n);
    (state->undo).undo_point = 0;
    (state->undo).redo_point = 99;
    (state->undo).undo_char_point = 0;
    (state->undo).redo_char_point = 999;
    state->cursor = 0;
    state->select_start = 0;
    state->select_end = 0;
    state->mode = '\0';
    state->cursor_at_end_of_line = '\0';
    state->initialized = '\x01';
    state->has_preferred_x = '\0';
    state->preferred_x = 0.0;
    state->single_line = '\x01';
    __s = &state->string;
    state->filter = (nk_plugin_filter)0x0;
    (state->scrollbar).x = 0.0;
    (state->scrollbar).y = 0.0;
    __n_00 = (ulong)__s & 3;
    if (__n_00 == 0) {
      (state->string).buffer.needed = 0;
      (state->string).buffer.calls = 0;
      *(undefined8 *)&(state->string).buffer.grow_factor = 0;
      (state->string).buffer.allocated = 0;
      (state->string).buffer.memory.ptr = (void *)0x0;
      (state->string).buffer.memory.size = 0;
      (state->string).buffer.pool.free = (nk_plugin_free)0x0;
      *(undefined8 *)&(state->string).buffer.type = 0;
      (state->string).buffer.pool.userdata.ptr = (void *)0x0;
      (state->string).buffer.pool.alloc = (nk_plugin_alloc)0x0;
      *(undefined8 *)((state->string).buffer.marker + 1) = 0;
      (state->string).buffer.marker[1].offset = 0;
      *(undefined8 *)(__s->buffer).marker = 0;
      (state->string).buffer.marker[0].offset = 0;
    }
    else {
      memset(__s,0,-__n_00 + 4);
      __s_01 = (void *)(-__n_00 + 0x78 + (long)__s);
      *(undefined8 *)((long)__s_01 + -0x74) = 0;
      *(undefined8 *)((long)__s_01 + -0x6c) = 0;
      *(undefined8 *)((long)__s_01 + -100) = 0;
      *(undefined8 *)((long)__s_01 + -0x5c) = 0;
      *(undefined8 *)((long)__s_01 + -0x54) = 0;
      *(undefined8 *)((long)__s_01 + -0x4c) = 0;
      *(undefined8 *)((long)__s_01 + -0x44) = 0;
      *(undefined8 *)((long)__s_01 + -0x3c) = 0;
      *(undefined8 *)((long)__s_01 + -0x34) = 0;
      *(undefined8 *)((long)__s_01 + -0x2c) = 0;
      *(undefined8 *)((long)__s_01 + -0x24) = 0;
      *(undefined8 *)((long)__s_01 + -0x1c) = 0;
      *(undefined8 *)((long)__s_01 + -0x14) = 0;
      *(undefined8 *)((long)__s_01 + -0xc) = 0;
      *(undefined4 *)((long)__s_01 + -4) = 0;
      memset(__s_01,0,__n_00);
    }
    (state->string).buffer.type = NK_BUFFER_FIXED;
    (state->string).buffer.memory.ptr = memory;
    (state->string).buffer.memory.size = size;
    (state->string).buffer.size = size;
    (state->string).len = 0;
  }
  return;
}

Assistant:

NK_API void
nk_textedit_init_fixed(struct nk_text_edit *state, void *memory, nk_size size)
{
NK_ASSERT(state);
NK_ASSERT(memory);
if (!state || !memory || !size) return;
NK_MEMSET(state, 0, sizeof(struct nk_text_edit));
nk_textedit_clear_state(state, NK_TEXT_EDIT_SINGLE_LINE, 0);
nk_str_init_fixed(&state->string, memory, size);
}